

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_rela589n.cxx
# Opt level: O1

void newGenerationSort(int64_t **arr,int len)

{
  int64_t *piVar1;
  int64_t *piVar2;
  int64_t *piVar3;
  uint uVar4;
  long __tmp_2;
  long lVar5;
  long __tmp_1;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long *plVar12;
  int iVar13;
  long __tmp;
  int len_00;
  int i;
  ulong uVar14;
  bool bVar15;
  int64_t *restSecond;
  int64_t *restFirst;
  int64_t *selection;
  int64_t *part2;
  int64_t *local_68;
  int64_t *local_60;
  int64_t *local_58;
  int64_t *local_50;
  ulong local_48;
  ulong local_40;
  int64_t **local_38;
  
  uVar8 = 8;
  if (len < 8) {
    uVar8 = (ulong)(uint)len;
  }
  piVar3 = *arr;
  iVar7 = (int)uVar8;
  if (1 < len) {
    uVar4 = 2;
    iVar13 = 1;
    do {
      uVar11 = (ulong)uVar4;
      do {
        uVar10 = (int)uVar11 - 1;
        uVar11 = (ulong)uVar10;
        lVar5 = piVar3[uVar11 - 1];
        if (lVar5 <= piVar3[uVar11]) break;
        piVar3[uVar11 - 1] = piVar3[uVar11];
        piVar3[uVar11] = lVar5;
      } while (1 < (int)uVar10);
      uVar4 = uVar4 + 1;
      bVar15 = iVar13 != iVar7 + -1;
      iVar13 = iVar13 + 1;
    } while (bVar15);
  }
  if (8 < len) {
    uVar14 = (ulong)(uint)len;
    uVar11 = 0xffffffffffffffff;
    if (-1 < len * 2) {
      uVar11 = (long)(len * 2) * 8;
    }
    local_38 = arr;
    piVar1 = (int64_t *)operator_new__(uVar11);
    uVar4 = len - 2;
    piVar1[uVar14 - 1] = *piVar3;
    lVar5 = 0;
    do {
      piVar1[uVar14 + lVar5] = piVar3[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (uVar8 - 1 != lVar5);
    iVar9 = len + (int)lVar5;
    local_48 = (ulong)((uint)len >> 1) << 3;
    local_58 = piVar1;
    local_40 = uVar14;
    piVar2 = (int64_t *)operator_new__(local_48);
    local_60 = piVar2;
    local_68 = (int64_t *)operator_new__(local_48);
    iVar13 = 0;
    len_00 = 0;
    do {
      lVar5 = piVar3[uVar8];
      if (lVar5 < piVar1[iVar9 - iVar7]) {
        if (piVar1[(int)(uVar4 + iVar7)] < lVar5) {
          if ((uVar8 & 1) == 0) {
            lVar6 = (long)iVar13;
            iVar13 = iVar13 + 1;
            local_68[lVar6] = lVar5;
          }
          else {
            lVar6 = (long)len_00;
            len_00 = len_00 + 1;
            piVar2[lVar6] = lVar5;
          }
        }
        else {
          piVar1[(int)uVar4] = lVar5;
          lVar6 = piVar1[(long)(int)uVar4 + 1];
          if (lVar6 <= lVar5) {
            plVar12 = piVar1 + (int)uVar4;
            do {
              *plVar12 = lVar6;
              plVar12[1] = lVar5;
              lVar6 = plVar12[2];
              plVar12 = plVar12 + 1;
            } while (lVar6 <= lVar5);
          }
          uVar4 = uVar4 - 1;
        }
      }
      else {
        piVar1[iVar9] = lVar5;
        lVar6 = piVar1[(long)iVar9 + -1];
        if (lVar5 < lVar6) {
          plVar12 = piVar1 + iVar9;
          do {
            plVar12[-1] = lVar5;
            *plVar12 = lVar6;
            lVar6 = plVar12[-2];
            plVar12 = plVar12 + -1;
          } while (lVar5 < lVar6);
        }
        iVar9 = iVar9 + 1;
      }
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < (int)local_40);
    if (dont_delete != piVar3) {
      operator_delete__(piVar3);
    }
    iVar9 = iVar9 + ~uVar4;
    piVar3 = glue(piVar1 + (long)(int)uVar4 + 1,(long)iVar9,(int64_t *)0x0,0);
    operator_delete__(piVar1);
    local_58 = piVar3;
    newGenerationSort(&local_60,len_00);
    newGenerationSort(&local_68,iVar13);
    if (iVar9 < len_00) {
      glueDelete(&local_58,&local_60,(long)len_00,&local_58,(long)iVar9);
      iVar9 = len_00 + iVar9;
      local_50 = local_68;
    }
    else {
      glueDelete(&local_50,&local_60,(long)len_00,&local_68,(long)iVar13);
      iVar13 = len_00 + iVar13;
    }
    glueDelete(local_38,&local_58,(long)iVar9,&local_50,(long)iVar13);
  }
  return;
}

Assistant:

static void newGenerationSort(SORT_TYPE *&arr, int len) {
  int localCatchUp =
      min(catchUp, len); // потому что мы не можем пытаться вставлять элемент за
                         // границами массива
  insertionSort(arr, 0,
                localCatchUp -
                    1); // для начала сортируем первые localCatchUp элементов

  if (len <=
      localCatchUp) // на случай если это массив на n <= catchUp элементов
    return;         // а также это база рекурсии

  SORT_TYPE *selection =
      new SORT_TYPE[len << 1]; // то же что и new int[len * 2]
  int left = len - 1; // индекс для хранения новых минимальных элементов
  int right = len; // индекс для хранения новых максимальных элементов

  selection[left--] = arr[0];
  for (int i = 1; i < localCatchUp; ++i) {
    selection[right++] = arr[i];
  }

  int restLen = len >> 1;
  SORT_TYPE *restFirst = new SORT_TYPE[restLen];
  SORT_TYPE *restSecond = new SORT_TYPE[restLen];

  int restFirstLen = 0;
  int restSecondLen = 0;

  for (int i = localCatchUp; i < len; ++i) {

    if (selection[right - localCatchUp] <= arr[i]) {
      selection[right] = arr[i];

      for (int j = right; selection[j - 1] > selection[j]; --j)
        swap(selection[j - 1], selection[j]);

      ++right;
      continue;
    }

    if (selection[left + localCatchUp] >= arr[i]) {
      selection[left] = arr[i];

      for (int j = left; selection[j] >= selection[j + 1]; ++j)
        swap(selection[j], selection[j + 1]);

      --left;
      continue;
    }

    if (i & 1) { // i - непарное
      restFirst[restFirstLen++] = arr[i];
    } else {
      restSecond[restSecondLen++] = arr[i];
    }
  }
  safe_delete(arr);

  int selectionLen = right - left - 1; // просто длина нашей выборки
  SORT_TYPE *copy = glue(selection + left + 1, selectionLen, nullptr,
                         0); // копируем все элементы выборки в новый массив

  delete[] selection; // удаляем массив размером 2 * len элементов и
  selection =
      copy; // вместо него используем ровно столько памяти, сколько нужно

  newGenerationSort(restFirst, restFirstLen);
  newGenerationSort(restSecond, restSecondLen);

  SORT_TYPE *part2;
  int part2Len;
  if (selectionLen < restFirstLen) {
    glueDelete(selection, restFirst, restFirstLen, selection,
               selectionLen); // selection += restFirst
    selectionLen += restFirstLen;

    part2 = restSecond;
    part2Len = restSecondLen;
  } else {
    glueDelete(part2, restFirst, restFirstLen, restSecond,
               restSecondLen); // part2 = restFirst + restSecond
    part2Len = restFirstLen + restSecondLen;
  }

  glueDelete(arr, selection, selectionLen, part2, part2Len);
}